

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
spirv_cross::ParsedIR::set_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration,uint32_t argument)

{
  TypedID<(spirv_cross::Types)1> *other;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  unsigned_long *puVar3;
  TypedID<(spirv_cross::Types)0> local_4c;
  Decoration *local_48;
  Decoration *dec;
  TypedID<(spirv_cross::Types)0> local_34;
  size_t local_30;
  TypedID<(spirv_cross::Types)0> local_28;
  BuiltIn local_24;
  Decoration local_20;
  uint32_t argument_local;
  Decoration decoration_local;
  uint32_t index_local;
  ParsedIR *this_local;
  TypeID id_local;
  
  this_00 = &this->meta;
  other = (TypedID<(spirv_cross::Types)1> *)((long)&this_local + 4);
  local_24 = argument;
  local_20 = decoration;
  argument_local = index;
  _decoration_local = this;
  this_local._4_4_ = id.id;
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>(&local_28,other);
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](this_00,&local_28);
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>(&local_34,other);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](this_00,&local_34);
  local_30 = VectorView<spirv_cross::Meta::Decoration>::size
                       (&(pmVar2->members).super_VectorView<spirv_cross::Meta::Decoration>);
  dec = (Decoration *)((ulong)argument_local + 1);
  puVar3 = ::std::max<unsigned_long>(&local_30,(unsigned_long *)&dec);
  SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&pmVar1->members,*puVar3);
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>(&local_4c,other);
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](this_00,&local_4c);
  local_48 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&(pmVar1->members).super_VectorView<spirv_cross::Meta::Decoration>,
                        (ulong)argument_local);
  Bitset::set(&local_48->decoration_flags,local_20);
  switch(local_20) {
  case DecorationSpecId:
    local_48->spec_id = local_24;
    break;
  default:
    break;
  case DecorationMatrixStride:
    local_48->matrix_stride = local_24;
    break;
  case DecorationBuiltIn:
    local_48->builtin = true;
    local_48->builtin_type = local_24;
    break;
  case DecorationStream:
    local_48->stream = local_24;
    break;
  case DecorationLocation:
    local_48->location = local_24;
    break;
  case DecorationComponent:
    local_48->component = local_24;
    break;
  case DecorationIndex:
    local_48->index = local_24;
    break;
  case DecorationBinding:
    local_48->binding = local_24;
    break;
  case DecorationOffset:
    local_48->offset = local_24;
    break;
  case DecorationXfbBuffer:
    local_48->xfb_buffer = local_24;
    break;
  case DecorationXfbStride:
    local_48->xfb_stride = local_24;
  }
  return;
}

Assistant:

void ParsedIR::set_member_decoration(TypeID id, uint32_t index, Decoration decoration, uint32_t argument)
{
	meta[id].members.resize(max(meta[id].members.size(), size_t(index) + 1));
	auto &dec = meta[id].members[index];
	dec.decoration_flags.set(decoration);

	switch (decoration)
	{
	case DecorationBuiltIn:
		dec.builtin = true;
		dec.builtin_type = static_cast<BuiltIn>(argument);
		break;

	case DecorationLocation:
		dec.location = argument;
		break;

	case DecorationComponent:
		dec.component = argument;
		break;

	case DecorationBinding:
		dec.binding = argument;
		break;

	case DecorationOffset:
		dec.offset = argument;
		break;

	case DecorationXfbBuffer:
		dec.xfb_buffer = argument;
		break;

	case DecorationXfbStride:
		dec.xfb_stride = argument;
		break;

	case DecorationStream:
		dec.stream = argument;
		break;

	case DecorationSpecId:
		dec.spec_id = argument;
		break;

	case DecorationMatrixStride:
		dec.matrix_stride = argument;
		break;

	case DecorationIndex:
		dec.index = argument;
		break;

	default:
		break;
	}
}